

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O1

CURLcode Curl_output_ntlm(Curl_easy *data,_Bool proxy)

{
  long lVar1;
  byte *pbVar2;
  int iVar3;
  connectdata *pcVar4;
  proxy_info *ppVar5;
  long lVar6;
  Curl_easy *pCVar7;
  ulong uVar8;
  CURLcode CVar9;
  uchar *puVar10;
  size_t sVar11;
  char **ppcVar12;
  char **ppcVar13;
  ulong uVar14;
  undefined7 in_register_00000031;
  char *pcVar15;
  char **ppcVar16;
  char *passwdp;
  char *userp;
  char *base64;
  size_t len;
  bufref ntlmmsg;
  char *local_88;
  int local_7c;
  long local_78;
  ntlmdata *local_70;
  Curl_easy *local_68;
  size_t local_60;
  bufref local_58;
  char *local_40;
  ulong local_38;
  
  local_88 = (char *)0x0;
  local_60 = 0;
  pcVar4 = data->conn;
  local_7c = (int)CONCAT71(in_register_00000031,proxy);
  local_70 = &pcVar4->proxyntlm;
  if (local_7c == 0) {
    local_70 = &pcVar4->ntlm;
  }
  ppVar5 = (proxy_info *)&pcVar4->host;
  if (local_7c != 0) {
    ppVar5 = &pcVar4->http_proxy;
  }
  ppcVar13 = (data->set).str + 0xc;
  if (local_7c != 0) {
    ppcVar13 = (data->set).str + 0x19;
  }
  ppcVar16 = &(data->state).aptr.passwd;
  if (local_7c != 0) {
    ppcVar16 = &(data->state).aptr.proxypasswd;
  }
  local_78 = 0x1370;
  if (local_7c != 0) {
    local_78 = 0x13b8;
  }
  uVar14 = CONCAT71(in_register_00000031,proxy) & 0xffffffff;
  ppcVar12 = &(data->state).aptr.user;
  if (local_7c != 0) {
    ppcVar12 = &(data->state).aptr.proxyuser;
  }
  local_38 = (ulong)(uint)(local_7c << 5);
  pcVar15 = "HTTP";
  if (*ppcVar13 != (char *)0x0) {
    pcVar15 = *ppcVar13;
  }
  passwdp = *ppcVar16;
  userp = *ppcVar12;
  local_40 = (ppVar5->host).name;
  pbVar2 = &(data->state).authhost.field_0x18 + local_38;
  *pbVar2 = *pbVar2 & 0xfe;
  if (userp == (char *)0x0) {
    userp = "";
  }
  lVar1 = uVar14 * 4;
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  local_68 = data;
  Curl_bufref_init(&local_58);
  uVar8 = local_38;
  pCVar7 = local_68;
  lVar6 = local_78;
  if (*(int *)((pcVar4->ntlm).nonce + uVar14 * 4 + -0xc) == 3) {
    puVar10 = (pcVar4->ntlm).nonce + lVar1 + -0xc;
    puVar10[0] = '\x04';
    puVar10[1] = '\0';
    puVar10[2] = '\0';
    puVar10[3] = '\0';
  }
  iVar3 = *(int *)((pcVar4->ntlm).nonce + lVar1 + -0xc);
  if (iVar3 == 2) {
    CVar9 = Curl_auth_create_ntlm_type3_message(local_68,userp,passwdp,local_70,&local_58);
    if (CVar9 != CURLE_OK) goto LAB_0013be75;
    sVar11 = Curl_bufref_len(&local_58);
    if (sVar11 != 0) {
      puVar10 = Curl_bufref_ptr(&local_58);
      sVar11 = Curl_bufref_len(&local_58);
      CVar9 = Curl_base64_encode((char *)puVar10,sVar11,&local_88,&local_60);
      lVar6 = local_78;
      if (CVar9 == CURLE_OK) {
        (*Curl_cfree)(*(void **)((long)&pCVar7->magic + local_78));
        pcVar15 = "";
        if ((char)local_7c != '\0') {
          pcVar15 = "Proxy-";
        }
        CVar9 = CURLE_OK;
        pcVar15 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar15,local_88);
        *(char **)((long)&pCVar7->magic + lVar6) = pcVar15;
        (*Curl_cfree)(local_88);
        if (*(long *)((long)&pCVar7->magic + lVar6) == 0) {
          CVar9 = CURLE_OUT_OF_MEMORY;
        }
        else {
          puVar10 = (pcVar4->ntlm).nonce + lVar1 + -0xc;
          puVar10[0] = '\x03';
          puVar10[1] = '\0';
          puVar10[2] = '\0';
          puVar10[3] = '\0';
          pbVar2 = &(pCVar7->state).authhost.field_0x18 + uVar8;
          *pbVar2 = *pbVar2 | 1;
        }
      }
      goto LAB_0013be75;
    }
  }
  else {
    if (iVar3 != 4) {
      CVar9 = Curl_auth_create_ntlm_type1_message
                        (local_68,userp,passwdp,pcVar15,local_40,local_70,&local_58);
      if (CVar9 == CURLE_OK) {
        puVar10 = Curl_bufref_ptr(&local_58);
        sVar11 = Curl_bufref_len(&local_58);
        CVar9 = Curl_base64_encode((char *)puVar10,sVar11,&local_88,&local_60);
        lVar1 = local_78;
        if (CVar9 == CURLE_OK) {
          (*Curl_cfree)(*(void **)((long)&pCVar7->magic + local_78));
          pcVar15 = "";
          if ((char)local_7c != '\0') {
            pcVar15 = "Proxy-";
          }
          pcVar15 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar15,local_88);
          *(char **)((long)&pCVar7->magic + lVar1) = pcVar15;
          (*Curl_cfree)(local_88);
          CVar9 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)&pCVar7->magic + lVar1) != 0) {
            CVar9 = CURLE_OK;
          }
        }
      }
      goto LAB_0013be75;
    }
    (*Curl_cfree)(*(void **)((long)&local_68->magic + local_78));
    *(undefined8 *)((long)&pCVar7->magic + lVar6) = 0;
    pbVar2 = &(pCVar7->state).authhost.field_0x18 + uVar8;
    *pbVar2 = *pbVar2 | 1;
  }
  CVar9 = CURLE_OK;
LAB_0013be75:
  Curl_bufref_free(&local_58);
  return CVar9;
}

Assistant:

CURLcode Curl_output_ntlm(struct Curl_easy *data, bool proxy)
{
  char *base64 = NULL;
  size_t len = 0;
  CURLcode result = CURLE_OK;
  struct bufref ntlmmsg;

  /* point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for an HTTP proxy */
  char **allocuserpwd;

  /* point to the username, password, service and host */
  const char *userp;
  const char *passwdp;
  const char *service = NULL;
  const char *hostname = NULL;

  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  curlntlm *state;
  struct auth *authp;
  struct connectdata *conn = data->conn;

  DEBUGASSERT(conn);
  DEBUGASSERT(data);

  if(proxy) {
#ifndef CURL_DISABLE_PROXY
    allocuserpwd = &data->state.aptr.proxyuserpwd;
    userp = data->state.aptr.proxyuser;
    passwdp = data->state.aptr.proxypasswd;
    service = data->set.str[STRING_PROXY_SERVICE_NAME] ?
      data->set.str[STRING_PROXY_SERVICE_NAME] : "HTTP";
    hostname = conn->http_proxy.host.name;
    ntlm = &conn->proxyntlm;
    state = &conn->proxy_ntlm_state;
    authp = &data->state.authproxy;
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  else {
    allocuserpwd = &data->state.aptr.userpwd;
    userp = data->state.aptr.user;
    passwdp = data->state.aptr.passwd;
    service = data->set.str[STRING_SERVICE_NAME] ?
      data->set.str[STRING_SERVICE_NAME] : "HTTP";
    hostname = conn->host.name;
    ntlm = &conn->ntlm;
    state = &conn->http_ntlm_state;
    authp = &data->state.authhost;
  }
  authp->done = FALSE;

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#ifdef USE_WINDOWS_SSPI
  if(!Curl_hSecDll) {
    /* not thread safe and leaks - use curl_global_init() to avoid */
    CURLcode err = Curl_sspi_global_init();
    if(!Curl_hSecDll)
      return err;
  }
#ifdef SECPKG_ATTR_ENDPOINT_BINDINGS
  ntlm->sslContext = conn->sslContext;
#endif
#endif

  Curl_bufref_init(&ntlmmsg);

  /* connection is already authenticated, do not send a header in future
   * requests so go directly to NTLMSTATE_LAST */
  if(*state == NTLMSTATE_TYPE3)
    *state = NTLMSTATE_LAST;

  switch(*state) {
  case NTLMSTATE_TYPE1:
  default: /* for the weird cases we (re)start here */
    /* Create a type-1 message */
    result = Curl_auth_create_ntlm_type1_message(data, userp, passwdp,
                                                 service, hostname,
                                                 ntlm, &ntlmmsg);
    if(!result) {
      DEBUGASSERT(Curl_bufref_len(&ntlmmsg) != 0);
      result = Curl_base64_encode((const char *) Curl_bufref_ptr(&ntlmmsg),
                                  Curl_bufref_len(&ntlmmsg), &base64, &len);
      if(!result) {
        free(*allocuserpwd);
        *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                                proxy ? "Proxy-" : "",
                                base64);
        free(base64);
        if(!*allocuserpwd)
          result = CURLE_OUT_OF_MEMORY;
      }
    }
    break;

  case NTLMSTATE_TYPE2:
    /* We already received the type-2 message, create a type-3 message */
    result = Curl_auth_create_ntlm_type3_message(data, userp, passwdp,
                                                 ntlm, &ntlmmsg);
    if(!result && Curl_bufref_len(&ntlmmsg)) {
      result = Curl_base64_encode((const char *) Curl_bufref_ptr(&ntlmmsg),
                                  Curl_bufref_len(&ntlmmsg), &base64, &len);
      if(!result) {
        free(*allocuserpwd);
        *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                                proxy ? "Proxy-" : "",
                                base64);
        free(base64);
        if(!*allocuserpwd)
          result = CURLE_OUT_OF_MEMORY;
        else {
          *state = NTLMSTATE_TYPE3; /* we send a type-3 */
          authp->done = TRUE;
        }
      }
    }
    break;

  case NTLMSTATE_LAST:
    Curl_safefree(*allocuserpwd);
    authp->done = TRUE;
    break;
  }
  Curl_bufref_free(&ntlmmsg);

  return result;
}